

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileReceiver.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type sVar1;
  undefined1 sdkConnection [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar2;
  OutputWorker *pOVar3;
  size_t sVar4;
  char *pcVar5;
  string hostname;
  SDKJsonResult result;
  P2PFileReceiver receiver;
  string local_2b0;
  char *local_290;
  long local_288;
  char local_280 [16];
  SDKJsonResult local_270;
  undefined1 local_248 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_240;
  long local_238 [14];
  ios_base local_1c8 [264];
  P2PFileReceiver local_c0;
  
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"127.0.0.1","");
  sVar1 = local_2b0._M_string_length;
  if (argc < 2) {
    if (argc == 1) {
      pcVar5 = *argv;
    }
    else {
      pcVar5 = "P2PFileSender";
    }
    if ((int)Logger.ChannelMinLevel < 3) {
      local_248 = (undefined1  [8])Logger.ChannelName;
      _Stack_240._M_pi._0_4_ = 2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Usage: ",7);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)(ostringstream *)local_238 + (int)*(undefined8 *)(local_238[0] + -0x18)
                       );
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar5,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238," <Rendezvous Server Hostname>",0x1d);
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
      goto LAB_0010458a;
    }
  }
  else {
    pcVar5 = argv[1];
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&local_2b0,0,(char *)sVar1,(ulong)pcVar5);
    if ((int)Logger.ChannelMinLevel < 3) {
      local_248 = (undefined1  [8])Logger.ChannelName;
      _Stack_240._M_pi._0_4_ = 2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Server hostname: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,", port: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238," - Also broadcasting on the LAN to find server",0x2e);
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
LAB_0010458a:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
      std::ios_base::~ios_base(local_1c8);
    }
  }
  tonk::SDKSocket::SDKSocket(&local_c0.super_SDKSocket);
  local_c0.super_SDKSocket._vptr_SDKSocket = (_func_int **)&PTR__SDKSocket_0010aa60;
  local_c0.Complete._M_base._M_i = (__atomic_base<bool>)false;
  bVar2 = P2PFileReceiver::Initialize(&local_c0);
  if (bVar2) {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001046c8;
    local_248 = (undefined1  [8])Logger.ChannelName;
    _Stack_240._M_pi._0_4_ = 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"File sending client started",0x1b);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
  }
  else {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001046c8;
    local_248 = (undefined1  [8])Logger.ChannelName;
    _Stack_240._M_pi._0_4_ = 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"File sending server failed to start",0x23);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base(local_1c8);
LAB_001046c8:
  local_248 = (undefined1  [8])0x0;
  local_270._0_8_ = &local_c0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<FileReceiverServerConnection,std::allocator<FileReceiverServerConnection>,P2PFileReceiver*>
            (&_Stack_240,(FileReceiverServerConnection **)local_248,
             (allocator<FileReceiverServerConnection> *)&local_290,(P2PFileReceiver **)&local_270);
  std::__shared_ptr<FileReceiverServerConnection,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<FileReceiverServerConnection,FileReceiverServerConnection>
            ((__shared_ptr<FileReceiverServerConnection,(__gnu_cxx::_Lock_policy)2> *)local_248,
             (FileReceiverServerConnection *)local_248);
  this._M_pi = _Stack_240._M_pi;
  sdkConnection = local_248;
  _Stack_240._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_248 = (undefined1  [8])0x0;
  tonk::SDKSocket::Connect
            (&local_270,&local_c0.super_SDKSocket,(SDKConnection *)sdkConnection,&local_2b0,0x285e);
  if (local_270.super_SDKResult.Result != Tonk_Success) {
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,local_270.ErrorJson._M_dataplus._M_p,
               local_270.ErrorJson._M_dataplus._M_p + local_270.ErrorJson._M_string_length);
    if ((int)Logger.ChannelMinLevel < 3) {
      local_248 = (undefined1  [8])Logger.ChannelName;
      _Stack_240._M_pi._0_4_ = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Client connection failed: ",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,local_290,local_288);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238," - Going to advertise on the LAN looking for connections",
                 0x38);
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
      std::ios_base::~ios_base(local_1c8);
    }
    if (local_290 != local_280) {
      operator_delete(local_290);
    }
  }
  if (local_270.ErrorJson._M_dataplus._M_p != (pointer)((long)&local_270 + 0x18U)) {
    operator_delete(local_270.ErrorJson._M_dataplus._M_p);
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    local_248 = (undefined1  [8])Logger.ChannelName;
    _Stack_240._M_pi._0_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Client shutdown",0xf);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base(local_1c8);
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  tonk::SDKSocket::~SDKSocket(&local_c0.super_SDKSocket);
  if ((int)Logger.ChannelMinLevel < 2) {
    local_248 = (undefined1  [8])Logger.ChannelName;
    _Stack_240._M_pi._0_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"Press ENTER key to terminate",0x1c);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base(local_1c8);
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    local_248 = (undefined1  [8])Logger.ChannelName;
    _Stack_240._M_pi._0_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"...Key press detected.  Terminating..",0x25);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_248);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base(local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    std::string hostname = "127.0.0.1";

    if (argc >= 2) {
        hostname = argv[1];
        Logger.Info("Server hostname: ", hostname, ", port: ", kFileRendezvousServerPort,
            " - Also broadcasting on the LAN to find server");
    }
    else
    {
        const char* exe = (argc > 0 ? argv[0] : "P2PFileSender");
        Logger.Info("Usage: ", exe, " <Rendezvous Server Hostname>");
    }

    {
        P2PFileReceiver receiver;

        if (receiver.Initialize()) {
            Logger.Debug("File sending client started");
        }
        else {
            Logger.Debug("File sending server failed to start");
        }

        std::shared_ptr<FileReceiverServerConnection> connection;

        {
            connection = std::make_shared<FileReceiverServerConnection>(&receiver);

            auto result = receiver.Connect(connection.get(), hostname, kFileRendezvousServerPort);

            if (result.Failed())
            {
                Logger.Info("Client connection failed: ", result.ToString(),
                    " - Going to advertise on the LAN looking for connections");
            }
        }

        ::getchar();

        Logger.Debug("Client shutdown");
    }

    Logger.Debug("Press ENTER key to terminate");

    ::getchar();

    Logger.Debug("...Key press detected.  Terminating..");

    return 0;
}